

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall
spvtools::opt::analysis::ConstantManager::MapConstantToInst
          (ConstantManager *this,Constant *const_value,Instruction *inst)

{
  byte extraout_DL;
  value_type *__x;
  uint32_t local_6c;
  pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int> local_68;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false,_false>,_bool>
  *local_58;
  uint32_t local_44;
  pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*> local_40;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false,_false>,_bool>
  *local_30;
  Instruction *local_20;
  Instruction *inst_local;
  Constant *const_value_local;
  ConstantManager *this_local;
  
  local_20 = inst;
  inst_local = (Instruction *)const_value;
  const_value_local = (Constant *)this;
  local_44 = Instruction::result_id(inst);
  std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>::
  pair<unsigned_int,_const_spvtools::opt::analysis::Constant_*&,_true>
            (&local_40,&local_44,(Constant **)&inst_local);
  local_58 = std::
             unordered_map<unsigned_int,_const_spvtools::opt::analysis::Constant_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>_>
             ::insert((pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>,_false,_false>,_bool>
                       *)&this->id_to_const_val_,
                      (unordered_map<unsigned_int,_const_spvtools::opt::analysis::Constant_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::analysis::Constant_*>_>_>
                       *)&local_40,__x);
  if ((extraout_DL & 1) != 0) {
    local_30 = local_58;
    local_6c = Instruction::result_id(local_20);
    std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>::
    pair<const_spvtools::opt::analysis::Constant_*&,_unsigned_int,_true>
              (&local_68,(Constant **)&inst_local,&local_6c);
    std::
    multimap<const_spvtools::opt::analysis::Constant_*,_unsigned_int,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
    ::insert(&this->const_val_to_id_,&local_68);
  }
  return;
}

Assistant:

void MapConstantToInst(const Constant* const_value, Instruction* inst) {
    if (id_to_const_val_.insert({inst->result_id(), const_value}).second) {
      const_val_to_id_.insert({const_value, inst->result_id()});
    }
  }